

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

void Ifd_ObjPrint(Ifd_Man_t *p,int iLit)

{
  int local_18;
  int local_14;
  int Counter;
  int iLit_local;
  Ifd_Man_t *p_local;
  
  local_18 = 0;
  local_14 = iLit;
  _Counter = p;
  if (iLit == 0) {
    printf("0");
  }
  else if (iLit == 1) {
    printf("1");
  }
  else {
    Ifd_ObjPrint_rec(p,iLit,&local_18,1);
  }
  return;
}

Assistant:

void Ifd_ObjPrint( Ifd_Man_t * p, int iLit )
{
    int Counter = 0;
    if ( iLit == 0 )
        { printf( "0" ); return; }
    if ( iLit == 1 )
        { printf( "1" ); return; }
    Ifd_ObjPrint_rec( p, iLit, &Counter, 1 );
}